

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

insert_result * __thiscall
crnlib::
hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        *this,uint *k,empty_type *v)

{
  raw_node *prVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  raw_node *prVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  (__return_storage_ptr__->first).m_pTable = (hash_map_type *)0x0;
  (__return_storage_ptr__->first).m_index = 0;
  __return_storage_ptr__->second = false;
  uVar9 = (this->m_values).m_size;
  if (uVar9 == 0) {
LAB_00139b46:
    uVar4 = (this->m_values).m_size * 2;
    uVar9 = 4;
    if (4 < uVar4) {
      uVar9 = uVar4;
    }
    rehash(this,uVar9);
    uVar9 = (this->m_values).m_size;
    if (uVar9 != 0) {
      uVar4 = *k;
      uVar11 = uVar4 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
      uVar8 = (ulong)uVar11;
      prVar1 = (this->m_values).m_p;
      prVar5 = prVar1 + uVar8;
      if (prVar5->m_bits[5] != '\0') {
        if (*(uint *)prVar5->m_bits == uVar4) {
LAB_00139b8c:
          (__return_storage_ptr__->first).m_pTable = this;
          (__return_storage_ptr__->first).m_index = uVar11;
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        uVar10 = (ulong)(uVar9 - 1);
        do {
          iVar6 = (int)uVar8;
          uVar8 = (ulong)(iVar6 - 1);
          if (iVar6 == 0) {
            uVar8 = uVar10;
          }
          uVar7 = (uint)uVar8;
          prVar5 = prVar5 + -1;
          if (iVar6 == 0) {
            prVar5 = prVar1 + uVar10;
          }
          bVar2 = uVar11 != uVar7;
          if (uVar11 == uVar7) {
LAB_00139bdc:
            bVar3 = false;
            goto LAB_00139bde;
          }
          if (prVar5->m_bits[5] == '\0') {
            bVar2 = true;
            goto LAB_00139bdc;
          }
        } while (*(uint *)prVar5->m_bits != uVar4);
        (__return_storage_ptr__->first).m_pTable = this;
        (__return_storage_ptr__->first).m_index = uVar7;
        __return_storage_ptr__->second = false;
        bVar3 = true;
        bVar2 = false;
LAB_00139bde:
        uVar11 = uVar7;
        if (!bVar2) {
          if (bVar3) {
            return __return_storage_ptr__;
          }
          goto LAB_00139c0e;
        }
      }
      if (this->m_num_valid < this->m_grow_threshold) goto LAB_00139bed;
    }
LAB_00139c0e:
    crnlib_fail("\"insert() failed\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                ,0x204);
  }
  else {
    uVar4 = *k;
    uVar11 = uVar4 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
    uVar8 = (ulong)uVar11;
    prVar1 = (this->m_values).m_p;
    prVar5 = prVar1 + uVar8;
    if (prVar5->m_bits[5] != '\0') {
      if (*(uint *)prVar5->m_bits == uVar4) goto LAB_00139b8c;
      uVar10 = (ulong)(uVar9 - 1);
      do {
        iVar6 = (int)uVar8;
        uVar8 = (ulong)(iVar6 - 1);
        if (iVar6 == 0) {
          uVar8 = uVar10;
        }
        uVar7 = (uint)uVar8;
        prVar5 = prVar5 + -1;
        if (iVar6 == 0) {
          prVar5 = prVar1 + uVar10;
        }
        bVar2 = uVar11 != uVar7;
        if (uVar11 == uVar7) {
LAB_00139b27:
          bVar3 = false;
          goto LAB_00139b29;
        }
        if (prVar5->m_bits[5] == '\0') {
          bVar2 = true;
          goto LAB_00139b27;
        }
      } while (*(uint *)prVar5->m_bits != uVar4);
      (__return_storage_ptr__->first).m_pTable = this;
      (__return_storage_ptr__->first).m_index = uVar7;
      __return_storage_ptr__->second = false;
      bVar3 = true;
      bVar2 = false;
LAB_00139b29:
      uVar11 = uVar7;
      if (!bVar2) {
        if (bVar3) {
          return __return_storage_ptr__;
        }
        goto LAB_00139b46;
      }
    }
    if (this->m_grow_threshold <= this->m_num_valid) goto LAB_00139b46;
LAB_00139bed:
    *(uint *)prVar5->m_bits = uVar4;
    *(empty_type *)(prVar5->m_bits + 4) = *v;
    prVar5->m_bits[5] = '\x01';
    this->m_num_valid = this->m_num_valid + 1;
    (__return_storage_ptr__->first).m_pTable = this;
    (__return_storage_ptr__->first).m_index = uVar11;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
        {
            insert_result result;
            if (!insert_no_grow(result, k, v))
            {
                grow();

                // This must succeed.
                if (!insert_no_grow(result, k, v))
                {
                    CRNLIB_FAIL("insert() failed");
                }
            }

            return result;
        }